

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseEmitter::reportError(BaseEmitter *this,Error err,char *message)

{
  long *plVar1;
  char *in_RDX;
  Error in_ESI;
  long in_RDI;
  ErrorHandler *eh;
  undefined8 local_18;
  
  plVar1 = *(long **)(in_RDI + 0x40);
  if (plVar1 != (long *)0x0) {
    local_18 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_18 = DebugUtils::errorAsString(in_ESI);
    }
    (**(code **)(*plVar1 + 0x10))(plVar1,in_ESI,local_18,in_RDI);
  }
  return in_ESI;
}

Assistant:

Error BaseEmitter::reportError(Error err, const char* message) {
  ErrorHandler* eh = _errorHandler;
  if (eh) {
    if (!message)
      message = DebugUtils::errorAsString(err);
    eh->handleError(err, message, this);
  }
  return err;
}